

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O3

void insert<8000u,std::vector<unsigned_char*,std::allocator<unsigned_char*>>,BurstSimple<unsigned_char>,unsigned_char>
               (TrieNode<unsigned_char> *root,uchar **strings,size_t n)

{
  _WordT *p_Var1;
  byte bVar2;
  TrieNode<unsigned_char> *pTVar3;
  iterator __position;
  ulong uVar4;
  vector<unsigned_char*,std::allocator<unsigned_char*>> *this;
  TrieNode<unsigned_char> *pTVar5;
  size_t sVar6;
  ulong uVar7;
  size_t depth;
  ulong uVar8;
  uchar *str;
  BurstSimple<unsigned_char> local_61;
  byte *local_60;
  vector<unsigned_char*,std::allocator<unsigned_char*>> *local_58;
  TrieNode<unsigned_char> *local_50;
  size_t local_48;
  uchar **local_40;
  size_t local_38;
  
  if (n != 0) {
    sVar6 = 0;
    local_50 = root;
    local_48 = n;
    local_40 = strings;
    do {
      local_60 = local_40[sVar6];
      if (local_60 == (byte *)0x0) {
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      bVar2 = *local_60;
      uVar8 = (ulong)bVar2;
      uVar7 = (ulong)(bVar2 >> 6);
      depth = 1;
      uVar4 = (local_50->is_trie).super__Base_bitset<4UL>._M_w[uVar7] >> (uVar8 & 0x3f);
      pTVar3 = local_50;
      while (local_38 = sVar6, (uVar4 & 1) != 0) {
        if ((char)uVar8 == '\0') {
          __assert_fail("not is_end(c)",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort.cpp"
                        ,0xdf,
                        "void insert(TrieNode<CharT> *, unsigned char **, size_t) [Threshold = 8000U, BucketT = std::vector<unsigned char *>, BurstImpl = BurstSimple<unsigned char>, CharT = unsigned char]"
                       );
        }
        pTVar3 = (TrieNode<unsigned_char> *)(pTVar3->buckets)._M_elems[uVar8];
        bVar2 = local_60[depth];
        uVar8 = (ulong)bVar2;
        uVar7 = (ulong)(bVar2 >> 6);
        depth = depth + 1;
        uVar4 = (pTVar3->is_trie).super__Base_bitset<4UL>._M_w[uVar7] >> (uVar8 & 0x3f);
      }
      this = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)
             (pTVar3->buckets)._M_elems[uVar8];
      if (this == (vector<unsigned_char*,std::allocator<unsigned_char*>> *)0x0) {
        this = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)operator_new(0x18);
        *(undefined8 *)this = 0;
        *(undefined8 *)(this + 8) = 0;
        *(undefined8 *)(this + 0x10) = 0;
        (pTVar3->buckets)._M_elems[uVar8] = this;
      }
      __position._M_current = *(uchar ***)(this + 8);
      if (__position._M_current == *(uchar ***)(this + 0x10)) {
        local_58 = this;
        std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
        _M_realloc_insert<unsigned_char*const&>(this,__position,&local_60);
        this = local_58;
      }
      else {
        *__position._M_current = local_60;
        *(long *)(this + 8) = *(long *)(this + 8) + 8;
      }
      if ((bVar2 != 0) && (64000 < (ulong)(*(long *)(this + 8) - *(long *)this))) {
        pTVar5 = BurstSimple<unsigned_char>::operator()
                           (&local_61,
                            (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)this,depth)
        ;
        (pTVar3->buckets)._M_elems[uVar8] = pTVar5;
        p_Var1 = (pTVar3->is_trie).super__Base_bitset<4UL>._M_w + uVar7;
        *p_Var1 = *p_Var1 | 1L << (bVar2 & 0x3f);
        if (*(void **)this != (void *)0x0) {
          operator_delete(*(void **)this);
        }
        operator_delete(this);
      }
      sVar6 = local_38 + 1;
    } while (sVar6 != local_48);
  }
  return;
}

Assistant:

static inline void
insert(TrieNode<CharT>* root, unsigned char** strings, size_t n)
{
	for (size_t i=0; i < n; ++i) {
		unsigned char* str = strings[i];
		size_t depth = 0;
		CharT c = get_char<CharT>(str, 0);
		TrieNode<CharT>* node = root;
		while (node->is_trie[c]) {
			assert(not is_end(c));
			node = static_cast<TrieNode<CharT>*>(node->buckets[c]);
			depth += sizeof(CharT);
			c = get_char<CharT>(str, depth);
		}
		BucketT* bucket = static_cast<BucketT*>(node->buckets[c]);
		if (not bucket) {
			node->buckets[c] = bucket = new BucketT;
		}
		bucket->push_back(str);
		if (is_end(c)) continue;
		if (bucket->size() > Threshold) {
			node->buckets[c] = BurstImpl()(*bucket,
					depth+sizeof(CharT));
			node->is_trie[c] = true;
			delete bucket;
		}
	}
}